

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int iStart;
  int iVar1;
  ExprList *pList;
  Vdbe *p;
  int iVar2;
  VdbeOp *pVVar3;
  KeyInfo *pKVar4;
  int p1;
  int iVar5;
  int p1_00;
  int iVar6;
  int iVar7;
  int nBase;
  char cVar8;
  uint uVar9;
  int p1_01;
  int target;
  int local_68;
  
  uVar9 = pSort->sortFlags & 1;
  pList = pSort->pOrderBy;
  iVar6 = pList->nExpr;
  iVar7 = (uVar9 ^ 1) + iVar6;
  nBase = nData + iVar7;
  iStart = pSort->nOBSat;
  if (nPrefixReg == 0) {
    target = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + nBase;
  }
  else {
    target = regData - nPrefixReg;
  }
  if (pSelect->iOffset == 0) {
    p1 = pSelect->iLimit;
  }
  else {
    p1 = pSelect->iOffset + 1;
  }
  p = pParse->pVdbe;
  iVar5 = pParse->nLabel + -1;
  pParse->nLabel = iVar5;
  pSort->labelDone = iVar5;
  sqlite3ExprCodeExprList(pParse,pList,target,regOrigData,(regOrigData != 0) * '\x04' + '\x01');
  cVar8 = (char)uVar9;
  if (cVar8 == '\0') {
    sqlite3VdbeAddOp2(p,0x78,pSort->iECursor,target + iVar6);
  }
  if (0 < nData && nPrefixReg == 0) {
    sqlite3ExprCodeMove(pParse,regData,iVar7 + target,nData);
  }
  local_68 = 0;
  iVar7 = 0;
  if (0 < iStart) {
    iVar7 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
    iVar5 = pSort->nOBSat;
    p1_01 = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + iVar5;
    if (cVar8 == '\0') {
      iVar2 = target + iVar6;
      iVar1 = 0x14;
    }
    else {
      iVar2 = pSort->iECursor;
      iVar1 = 0x73;
    }
    iVar2 = sqlite3VdbeAddOp1(p,iVar1,iVar2);
    sqlite3VdbeAddOp3(p,0x57,p1_01,target,pSort->nOBSat);
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pVVar3 = sqlite3VdbeGetOp(p,pSort->addrSortIndex);
    pVVar3->p2 = nBase - iVar5;
    pKVar4 = (pVVar3->p4).pKeyInfo;
    memset(pKVar4->aSortOrder,0,(ulong)pKVar4->nKeyField);
    sqlite3VdbeChangeP4(p,-1,(char *)pKVar4,-9);
    pKVar4 = sqlite3KeyInfoFromExprList
                       (pParse,pSort->pOrderBy,iStart,
                        ~(uint)pKVar4->nKeyField + (uint)pKVar4->nAllField);
    (pVVar3->p4).pKeyInfo = pKVar4;
    iVar1 = p->nOp;
    iVar5 = iVar1 + 1;
    sqlite3VdbeAddOp3(p,0x10,iVar5,0,iVar5);
    iVar5 = pParse->nLabel + -1;
    pParse->nLabel = iVar5;
    pSort->labelBkOut = iVar5;
    p1_00 = pParse->nMem + 1;
    pParse->nMem = p1_00;
    pSort->regReturn = p1_00;
    sqlite3VdbeAddOp2(p,0xc,p1_00,iVar5);
    sqlite3VdbeAddOp1(p,0x8a,pSort->iECursor);
    if (p1 != 0) {
      sqlite3VdbeAddOp2(p,0x14,p1,pSort->labelDone);
    }
    sqlite3VdbeJumpHere(p,iVar2);
    sqlite3ExprCodeMove(pParse,target,p1_01,pSort->nOBSat);
    sqlite3VdbeJumpHere(p,iVar1);
  }
  if (p1 != 0) {
    iVar5 = pSort->iECursor;
    sqlite3VdbeAddOp2(p,0x30,p1,p->nOp + 4);
    sqlite3VdbeAddOp2(p,0x20,iVar5,0);
    local_68 = sqlite3VdbeAddOp4Int(p,0x25,iVar5,0,target + iStart,iVar6 - iStart);
    sqlite3VdbeAddOp1(p,0x7b,iVar5);
  }
  if (iVar7 == 0) {
    iVar7 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
  }
  sqlite3VdbeAddOp4Int
            (p,0x84 - (pSort->sortFlags & 1),pSort->iECursor,iVar7,target + iStart,nBase - iStart);
  if (local_68 != 0) {
    iVar6 = pSort->labelOBLopt;
    if (iVar6 == 0) {
      iVar6 = p->nOp;
    }
    pVVar3 = sqlite3VdbeGetOp(p,local_68);
    pVVar3->p2 = iVar6;
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the regData data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = 0;                               /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */
  int iSkip = 0;                     /* End of the sorter insert loop */

  assert( bSeq==0 || bSeq==1 );

  /* Three cases:
  **   (1) The data to be sorted has already been packed into a Record
  **       by a prior OP_MakeRecord.  In this case nData==1 and regData
  **       will be completely unrelated to regOrigData.
  **   (2) All output columns are included in the sort record.  In that
  **       case regData==regOrigData.
  **   (3) Some output columns are omitted from the sort record due to
  **       the SQLITE_ENABLE_SORTER_REFERENCE optimization, or due to the
  **       SQLITE_ECEL_OMITREF optimization, or due to the 
  **       SortCtx.pDeferredRowLoad optimiation.  In any of these cases
  **       regOrigData is 0 to prevent this routine from trying to copy
  **       values that might not yet exist.
  */
  assert( nData==1 || regData==regOrigData || regOrigData==0 );

  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nPrefixReg;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(pParse);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr); 
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortOrder, 0, pKI->nKeyField); /* Makes OP_Jump testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nAllField > pKI->nKeyField+2 );
    pOp->p4.pKeyInfo = sqlite3KeyInfoFromExprList(pParse,pSort->pOrderBy,nOBSat,
                                           pKI->nAllField-pKI->nKeyField-1);
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(pParse);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( iLimit ){
    /* At this point the values for the new sorter entry are stored
    ** in an array of registers. They need to be composed into a record
    ** and inserted into the sorter if either (a) there are currently
    ** less than LIMIT+OFFSET items or (b) the new record is smaller than 
    ** the largest record currently in the sorter. If (b) is true and there
    ** are already LIMIT+OFFSET items in the sorter, delete the largest
    ** entry before inserting the new one. This way there are never more 
    ** than LIMIT+OFFSET items in the sorter.
    **
    ** If the new record does not need to be inserted into the sorter,
    ** jump to the next iteration of the loop. If the pSort->labelOBLopt
    ** value is not zero, then it is a label of where to jump.  Otherwise,
    ** just bypass the row insert logic.  See the header comment on the
    ** sqlite3WhereOrderByLimitOptLabel() function for additional info.
    */
    int iCsr = pSort->iECursor;
    sqlite3VdbeAddOp2(v, OP_IfNotZero, iLimit, sqlite3VdbeCurrentAddr(v)+4);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Last, iCsr, 0);
    iSkip = sqlite3VdbeAddOp4Int(v, OP_IdxLE,
                                 iCsr, 0, regBase+nOBSat, nExpr-nOBSat);
    VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Delete, iCsr);
  }
  if( regRecord==0 ){
    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iSkip ){
    sqlite3VdbeChangeP2(v, iSkip,
         pSort->labelOBLopt ? pSort->labelOBLopt : sqlite3VdbeCurrentAddr(v));
  }
}